

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void deleteMissingFiles(Options *options,QDir *srcDir,QDir *dstDir)

{
  FILE *__stream;
  bool bVar1;
  bool bVar2;
  QFlagsStorage<QDir::Filter> QVar3;
  QFlagsStorage<QDir::Filter> QVar4;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  QDir *in_RDX;
  Options *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  QFileInfo *src;
  QFileInfoList *__range2;
  bool found;
  QFileInfo *dst;
  QFileInfoList *__range1;
  const_iterator __end2;
  const_iterator __begin2;
  const_iterator __end1;
  const_iterator __begin1;
  QFileInfoList dstEntries;
  QFileInfoList srcEntries;
  FILE *in_stack_fffffffffffffd98;
  QList<QFileInfo> *in_stack_fffffffffffffda0;
  QString *in_stack_fffffffffffffdb8;
  QDir *srcDir_00;
  Options *options_00;
  undefined1 local_1e0 [24];
  undefined1 local_1c8 [24];
  QDir local_1b0 [8];
  QString local_1a8 [2];
  QString local_178 [2];
  undefined1 local_148 [24];
  QDir local_130 [8];
  undefined1 local_128 [24];
  QDir local_110 [56];
  QFileInfo *local_d8;
  const_iterator local_d0;
  const_iterator local_c8;
  QFileInfo *local_c0;
  const_iterator local_b8;
  const_iterator local_b0;
  QFlagsStorageHelper<QDir::Filter,_4> local_a4;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  QFlagsStorageHelper<QDir::Filter,_4> local_84;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  QString local_68 [2];
  QString local_38 [2];
  long local_8;
  
  __stream = _stdout;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(in_RDI + 1) & 1) != 0) {
    QDir::absolutePath();
    QtPrivate::asString(local_38);
    QString::toLocal8Bit(in_stack_fffffffffffffdb8);
    pcVar5 = QByteArray::constData((QByteArray *)0x10a2db);
    QDir::absolutePath();
    QtPrivate::asString(local_68);
    QString::toLocal8Bit(in_stack_fffffffffffffdb8);
    pcVar6 = QByteArray::constData((QByteArray *)0x10a31c);
    fprintf(__stream,"Delete missing files %s %s\n",pcVar5,pcVar6);
    QByteArray::~QByteArray((QByteArray *)0x10a344);
    QString::~QString((QString *)0x10a351);
    QByteArray::~QByteArray((QByteArray *)0x10a35e);
    QString::~QString((QString *)0x10a36b);
  }
  local_80 = 0xaaaaaaaaaaaaaaaa;
  local_78 = 0xaaaaaaaaaaaaaaaa;
  local_70 = 0xaaaaaaaaaaaaaaaa;
  options_00 = in_RSI;
  local_84.super_QFlagsStorage<QDir::Filter>.i =
       (QFlagsStorage<QDir::Filter>)
       operator|((enum_type)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                 (enum_type)in_stack_fffffffffffffda0);
  QVar3.i = (Int)QFlags<QDir::Filter>::operator|
                           ((QFlags<QDir::Filter> *)in_stack_fffffffffffffda0,
                            (Filter)((ulong)in_stack_fffffffffffffd98 >> 0x20));
  QFlags<QDir::SortFlag>::QFlags
            ((QFlags<QDir::SortFlag> *)in_stack_fffffffffffffda0,
             (SortFlag)((ulong)in_stack_fffffffffffffd98 >> 0x20));
  QDir::entryInfoList((QFlags *)&local_80,(QFlags *)in_RSI);
  local_a0 = 0xaaaaaaaaaaaaaaaa;
  local_98 = 0xaaaaaaaaaaaaaaaa;
  local_90 = 0xaaaaaaaaaaaaaaaa;
  srcDir_00 = in_RDX;
  local_a4.super_QFlagsStorage<QDir::Filter>.i =
       (QFlagsStorage<QDir::Filter>)
       operator|((enum_type)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                 (enum_type)in_stack_fffffffffffffda0);
  QVar4.i = (Int)QFlags<QDir::Filter>::operator|
                           ((QFlags<QDir::Filter> *)in_stack_fffffffffffffda0,
                            (Filter)((ulong)in_stack_fffffffffffffd98 >> 0x20));
  QFlags<QDir::SortFlag>::QFlags
            ((QFlags<QDir::SortFlag> *)in_stack_fffffffffffffda0,
             (SortFlag)((ulong)in_stack_fffffffffffffd98 >> 0x20));
  QDir::entryInfoList((QFlags *)&local_a0,(QFlags *)in_RDX);
  local_b0.i = (QFileInfo *)0xaaaaaaaaaaaaaaaa;
  local_b0 = QList<QFileInfo>::begin(in_stack_fffffffffffffda0);
  local_b8.i = (QFileInfo *)0xaaaaaaaaaaaaaaaa;
  local_b8 = QList<QFileInfo>::end(in_stack_fffffffffffffda0);
  do {
    local_c0 = local_b8.i;
    bVar1 = QList<QFileInfo>::const_iterator::operator!=(&local_b0,local_b8);
    if (!bVar1) {
      fflush(_stdout);
      QList<QFileInfo>::~QList((QList<QFileInfo> *)0x10a8dd);
      QList<QFileInfo>::~QList((QList<QFileInfo> *)0x10a8ea);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return;
    }
    QList<QFileInfo>::const_iterator::operator*(&local_b0);
    bVar1 = false;
    local_c8.i = (QFileInfo *)0xaaaaaaaaaaaaaaaa;
    local_c8 = QList<QFileInfo>::begin(in_stack_fffffffffffffda0);
    local_d0.i = (QFileInfo *)0xaaaaaaaaaaaaaaaa;
    local_d0 = QList<QFileInfo>::end(in_stack_fffffffffffffda0);
    while( true ) {
      local_d8 = local_d0.i;
      bVar2 = QList<QFileInfo>::const_iterator::operator!=(&local_c8,local_d0);
      if (!bVar2) break;
      QList<QFileInfo>::const_iterator::operator*(&local_c8);
      QFileInfo::fileName();
      QFileInfo::fileName();
      bVar2 = operator==((QString *)in_stack_fffffffffffffda0,(QString *)in_stack_fffffffffffffd98);
      QString::~QString((QString *)0x10a638);
      QString::~QString((QString *)0x10a645);
      if (bVar2) {
        uVar7 = QFileInfo::isDir();
        if ((uVar7 & 1) != 0) {
          QFileInfo::absoluteFilePath();
          QDir::QDir(local_110,(QString *)local_128);
          QFileInfo::absoluteFilePath();
          QDir::QDir(local_130,(QString *)local_148);
          deleteMissingFiles(options_00,srcDir_00,(QDir *)CONCAT44(QVar3.i,QVar4.i));
          QDir::~QDir(local_130);
          QString::~QString((QString *)0x10a6f4);
          QDir::~QDir(local_110);
          QString::~QString((QString *)0x10a70e);
        }
        bVar1 = true;
        break;
      }
      QList<QFileInfo>::const_iterator::operator++(&local_c8);
    }
    if (!bVar1) {
      if ((*(byte *)(in_RDI + 1) & 1) != 0) {
        in_stack_fffffffffffffd98 = _stdout;
        QFileInfo::fileName();
        QtPrivate::asString(local_178);
        QString::toLocal8Bit((QString *)in_RSI);
        in_stack_fffffffffffffda0 =
             (QList<QFileInfo> *)QByteArray::constData((QByteArray *)0x10a790);
        QDir::absolutePath();
        QtPrivate::asString(local_1a8);
        QString::toLocal8Bit((QString *)in_RSI);
        pcVar5 = QByteArray::constData((QByteArray *)0x10a7d1);
        fprintf(in_stack_fffffffffffffd98,"%s not found in %s, removing it.\n",
                in_stack_fffffffffffffda0,pcVar5);
        QByteArray::~QByteArray((QByteArray *)0x10a7f8);
        QString::~QString((QString *)0x10a805);
        QByteArray::~QByteArray((QByteArray *)0x10a812);
        QString::~QString((QString *)0x10a81f);
      }
      uVar7 = QFileInfo::isDir();
      if ((uVar7 & 1) == 0) {
        QFileInfo::absoluteFilePath();
        QFile::remove((QString *)local_1e0);
        QString::~QString((QString *)0x10a8ab);
      }
      else {
        QFileInfo::absolutePath();
        QDir::QDir(local_1b0,(QString *)local_1c8);
        QDir::removeRecursively();
        QDir::~QDir(local_1b0);
        QString::~QString((QString *)0x10a87d);
      }
    }
    QList<QFileInfo>::const_iterator::operator++(&local_b0);
  } while( true );
}

Assistant:

void deleteMissingFiles(const Options &options, const QDir &srcDir, const QDir &dstDir)
{
    if (options.verbose)
        fprintf(stdout, "Delete missing files %s %s\n", qPrintable(srcDir.absolutePath()), qPrintable(dstDir.absolutePath()));

    const QFileInfoList srcEntries = srcDir.entryInfoList(QDir::NoDotAndDotDot | QDir::Files | QDir::Dirs);
    const QFileInfoList dstEntries = dstDir.entryInfoList(QDir::NoDotAndDotDot | QDir::Files | QDir::Dirs);
    for (const QFileInfo &dst : dstEntries) {
        bool found = false;
        for (const QFileInfo &src : srcEntries)
            if (dst.fileName() == src.fileName()) {
                if (dst.isDir())
                    deleteMissingFiles(options, src.absoluteFilePath(), dst.absoluteFilePath());
                found = true;
                break;
            }

        if (!found) {
            if (options.verbose)
                fprintf(stdout, "%s not found in %s, removing it.\n", qPrintable(dst.fileName()), qPrintable(srcDir.absolutePath()));

            if (dst.isDir())
                QDir{dst.absolutePath()}.removeRecursively();
            else
                QFile::remove(dst.absoluteFilePath());
        }
    }
    fflush(stdout);
}